

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverApi.c
# Opt level: O1

void Msat_SolverResize(Msat_Solver_t *p,int nVarsAlloc)

{
  uint uVar1;
  int iVar2;
  double *pdVar3;
  float *pfVar4;
  int *piVar5;
  Msat_ClauseVec_t **ppMVar6;
  Msat_ClauseVec_t *pMVar7;
  Msat_Queue_t *pMVar8;
  Msat_Clause_t **ppMVar9;
  Msat_IntVec_t *Entry;
  long lVar10;
  int iVar11;
  size_t sVar12;
  long lVar13;
  
  uVar1 = p->nVarsAlloc;
  lVar13 = (long)(int)uVar1;
  p->nVarsAlloc = nVarsAlloc;
  if (p->pdActivity == (double *)0x0) {
    pdVar3 = (double *)malloc((long)nVarsAlloc << 3);
  }
  else {
    pdVar3 = (double *)realloc(p->pdActivity,(long)nVarsAlloc << 3);
  }
  p->pdActivity = pdVar3;
  sVar12 = (long)p->nVarsAlloc << 2;
  if (p->pFactors == (float *)0x0) {
    pfVar4 = (float *)malloc(sVar12);
  }
  else {
    pfVar4 = (float *)realloc(p->pFactors,sVar12);
  }
  p->pFactors = pfVar4;
  iVar11 = p->nVarsAlloc;
  if ((int)uVar1 < iVar11) {
    pdVar3 = p->pdActivity;
    lVar10 = lVar13;
    do {
      pdVar3[lVar10] = 0.0;
      pfVar4[lVar10] = 1.0;
      lVar10 = lVar10 + 1;
    } while (iVar11 != lVar10);
  }
  sVar12 = (long)iVar11 << 2;
  if (p->pAssigns == (int *)0x0) {
    piVar5 = (int *)malloc(sVar12);
  }
  else {
    piVar5 = (int *)realloc(p->pAssigns,sVar12);
  }
  p->pAssigns = piVar5;
  sVar12 = (long)p->nVarsAlloc << 2;
  if (p->pModel == (int *)0x0) {
    piVar5 = (int *)malloc(sVar12);
  }
  else {
    piVar5 = (int *)realloc(p->pModel,sVar12);
  }
  p->pModel = piVar5;
  iVar11 = p->nVarsAlloc;
  if ((int)uVar1 < iVar11) {
    piVar5 = p->pAssigns;
    lVar10 = lVar13;
    do {
      piVar5[lVar10] = -1;
      lVar10 = lVar10 + 1;
      iVar11 = p->nVarsAlloc;
    } while (lVar10 < iVar11);
  }
  Msat_OrderSetBounds(p->pOrder,iVar11);
  sVar12 = (long)p->nVarsAlloc << 4;
  if (p->pvWatched == (Msat_ClauseVec_t **)0x0) {
    ppMVar6 = (Msat_ClauseVec_t **)malloc(sVar12);
  }
  else {
    ppMVar6 = (Msat_ClauseVec_t **)realloc(p->pvWatched,sVar12);
  }
  p->pvWatched = ppMVar6;
  if ((int)uVar1 < p->nVarsAlloc) {
    lVar10 = (long)(int)(uVar1 * 2);
    do {
      pMVar7 = Msat_ClauseVecAlloc(0x10);
      p->pvWatched[lVar10] = pMVar7;
      lVar10 = lVar10 + 1;
    } while (SBORROW8(lVar10,(long)p->nVarsAlloc * 2) != lVar10 + (long)p->nVarsAlloc * -2 < 0);
  }
  Msat_QueueFree(p->pQueue);
  pMVar8 = Msat_QueueAlloc(p->nVarsAlloc);
  p->pQueue = pMVar8;
  sVar12 = (long)p->nVarsAlloc << 3;
  if (p->pReasons == (Msat_Clause_t **)0x0) {
    ppMVar9 = (Msat_Clause_t **)malloc(sVar12);
  }
  else {
    ppMVar9 = (Msat_Clause_t **)realloc(p->pReasons,sVar12);
  }
  p->pReasons = ppMVar9;
  sVar12 = (long)p->nVarsAlloc << 2;
  if (p->pLevel == (int *)0x0) {
    piVar5 = (int *)malloc(sVar12);
  }
  else {
    piVar5 = (int *)realloc(p->pLevel,sVar12);
  }
  p->pLevel = piVar5;
  iVar11 = p->nVarsAlloc;
  lVar10 = lVar13;
  if ((int)uVar1 < iVar11) {
    do {
      p->pReasons[lVar10] = (Msat_Clause_t *)0x0;
      p->pLevel[lVar10] = -1;
      lVar10 = lVar10 + 1;
      iVar11 = p->nVarsAlloc;
    } while (lVar10 < iVar11);
  }
  if (p->pSeen == (int *)0x0) {
    piVar5 = (int *)malloc((long)iVar11 << 2);
  }
  else {
    piVar5 = (int *)realloc(p->pSeen,(long)iVar11 << 2);
  }
  p->pSeen = piVar5;
  iVar11 = p->nVarsAlloc;
  if ((int)uVar1 < iVar11) {
    iVar11 = p->nVarsAlloc;
    iVar2 = uVar1 + 1;
    if ((int)(uVar1 + 1) < iVar11) {
      iVar2 = iVar11;
    }
    memset(piVar5 + lVar13,0,(ulong)(~uVar1 + iVar2) * 4 + 4);
  }
  Msat_IntVecGrow(p->vTrail,iVar11);
  Msat_IntVecGrow(p->vTrailLim,p->nVarsAlloc);
  iVar2 = Msat_ClauseVecReadSize(p->vAdjacents);
  iVar11 = p->nVarsAlloc;
  if (iVar2 < iVar11) {
    do {
      pMVar7 = p->vAdjacents;
      Entry = Msat_IntVecAlloc(5);
      Msat_ClauseVecPush(pMVar7,(Msat_Clause_t *)Entry);
      iVar2 = iVar2 + 1;
      iVar11 = p->nVarsAlloc;
    } while (iVar2 < iVar11);
  }
  Msat_IntVecFill(p->vVarsUsed,iVar11,1);
  return;
}

Assistant:

void Msat_SolverResize( Msat_Solver_t * p, int nVarsAlloc )
{
    int nVarsAllocOld, i;

    nVarsAllocOld = p->nVarsAlloc;
    p->nVarsAlloc = nVarsAlloc;

    p->pdActivity = ABC_REALLOC( double, p->pdActivity, p->nVarsAlloc );
    p->pFactors   = ABC_REALLOC( float, p->pFactors, p->nVarsAlloc );
    for ( i = nVarsAllocOld; i < p->nVarsAlloc; i++ )
    {
        p->pdActivity[i] = 0.0;
        p->pFactors[i]   = 1.0;
    }

    p->pAssigns  = ABC_REALLOC( int, p->pAssigns, p->nVarsAlloc );
    p->pModel    = ABC_REALLOC( int, p->pModel, p->nVarsAlloc );
    for ( i = nVarsAllocOld; i < p->nVarsAlloc; i++ )
        p->pAssigns[i] = MSAT_VAR_UNASSIGNED;

//    Msat_OrderRealloc( p->pOrder, p->pAssigns, p->pdActivity, p->nVarsAlloc );
    Msat_OrderSetBounds( p->pOrder, p->nVarsAlloc );

    p->pvWatched = ABC_REALLOC( Msat_ClauseVec_t *, p->pvWatched, 2 * p->nVarsAlloc );
    for ( i = 2 * nVarsAllocOld; i < 2 * p->nVarsAlloc; i++ )
        p->pvWatched[i] = Msat_ClauseVecAlloc( 16 );

    Msat_QueueFree( p->pQueue );
    p->pQueue    = Msat_QueueAlloc( p->nVarsAlloc );

    p->pReasons  = ABC_REALLOC( Msat_Clause_t *, p->pReasons, p->nVarsAlloc );
    p->pLevel    = ABC_REALLOC( int, p->pLevel, p->nVarsAlloc );
    for ( i = nVarsAllocOld; i < p->nVarsAlloc; i++ )
    {
        p->pReasons[i] = NULL;
        p->pLevel[i] = -1;
    }

    p->pSeen     = ABC_REALLOC( int, p->pSeen, p->nVarsAlloc );
    for ( i = nVarsAllocOld; i < p->nVarsAlloc; i++ )
        p->pSeen[i] = 0;

    Msat_IntVecGrow( p->vTrail, p->nVarsAlloc );
    Msat_IntVecGrow( p->vTrailLim, p->nVarsAlloc );

    // make sure the array of adjucents has room to store the variable numbers
    for ( i = Msat_ClauseVecReadSize(p->vAdjacents); i < p->nVarsAlloc; i++ )
        Msat_ClauseVecPush( p->vAdjacents, (Msat_Clause_t *)Msat_IntVecAlloc(5) );
    Msat_IntVecFill( p->vVarsUsed, p->nVarsAlloc, 1 );
}